

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void MIR_change_module_ctx(MIR_context_t old_ctx,MIR_module_t_conflict m,MIR_context_t new_ctx)

{
  MIR_context_t item;
  undefined8 *puVar1;
  MIR_insn_t_conflict pMVar2;
  MIR_alias_t MVar3;
  char *pcVar4;
  char *name;
  MIR_context_t pMVar5;
  MIR_context_t pMVar6;
  reg_desc_t *prVar7;
  size_t sVar8;
  char **ppcVar9;
  MIR_alias_t *pMVar10;
  ulong uVar11;
  DLIST_MIR_item_t *pDVar12;
  MIR_func_t pMVar13;
  DLIST_MIR_insn_t *pDVar14;
  MIR_str_t str;
  c2mir_ctx *local_40;
  MIR_error_func_t p_Stack_38;
  
  DLIST_MIR_module_t_remove(&old_ctx->all_modules,m);
  DLIST_MIR_module_t_append(&new_ctx->all_modules,m);
  pMVar5 = new_ctx;
  pcVar4 = get_ctx_str(new_ctx,m->name);
  pDVar12 = &m->items;
  m->name = pcVar4;
  while( true ) {
    item = (MIR_context_t)pDVar12->head;
    if (item == (MIR_context_t)0x0) {
      if (new_ctx->curr_label_num < old_ctx->curr_label_num) {
        new_ctx->curr_label_num = old_ctx->curr_label_num;
      }
      return;
    }
    if (item->temp_string != (VARR_char *)0x0) break;
    pcVar4 = MIR_item_name(pMVar5,(MIR_item_t_conflict)item);
    if (pcVar4 != (char *)0x0) {
      name = get_ctx_str(new_ctx,pcVar4);
      pMVar5 = (MIR_context_t)item_tab_find(old_ctx,pcVar4,m);
      if (pMVar5 == item) {
        item_tab_remove(old_ctx,(MIR_item_t_conflict)item);
        set_item_name((MIR_item_t_conflict)item,name);
        pMVar5 = new_ctx;
        pMVar6 = (MIR_context_t)item_tab_insert(new_ctx,(MIR_item_t_conflict)item);
        if (item != pMVar6) goto LAB_0011785a;
      }
      else {
        pMVar5 = item;
        set_item_name((MIR_item_t_conflict)item,name);
      }
    }
    if (*(MIR_item_type_t *)&item->insn_nops == MIR_func_item) {
      puVar1 = (undefined8 *)((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->func->internal
      ;
      prVar7 = VARR_reg_desc_taddr((VARR_reg_desc_t *)*puVar1);
      ppcVar9 = &prVar7[1].hard_reg_name;
      uVar11 = 1;
      while( true ) {
        sVar8 = VARR_reg_desc_tlength((VARR_reg_desc_t *)*puVar1);
        if (sVar8 <= uVar11) break;
        pcVar4 = get_ctx_str(new_ctx,ppcVar9[-1]);
        ppcVar9[-1] = pcVar4;
        if (*ppcVar9 != (char *)0x0) {
          pcVar4 = get_ctx_str(new_ctx,*ppcVar9);
          *ppcVar9 = pcVar4;
        }
        uVar11 = uVar11 + 1;
        ppcVar9 = ppcVar9 + 3;
      }
      pMVar5 = new_ctx;
      change_var_names(new_ctx,((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->func->vars);
      pMVar13 = ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->func;
      if (pMVar13->global_vars != (VARR_MIR_var_t *)0x0) {
        pMVar5 = new_ctx;
        change_var_names(new_ctx,pMVar13->global_vars);
        pMVar13 = ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->func;
      }
      pDVar14 = &pMVar13->insns;
      while (pMVar2 = pDVar14->head, pMVar2 != (MIR_insn_t_conflict)0x0) {
        pMVar10 = &pMVar2->ops[0].u.mem.nonalias;
        for (uVar11 = 0; uVar11 < *(uint *)&pMVar2->field_0x1c; uVar11 = uVar11 + 1) {
          if ((char)pMVar10[-4] == '\n') {
            if (pMVar10[-1] != 0) {
              pcVar4 = MIR_alias_name(old_ctx,pMVar10[-1]);
              pMVar5 = new_ctx;
              MVar3 = MIR_alias(new_ctx,pcVar4);
              pMVar10[-1] = MVar3;
            }
            if (*pMVar10 != 0) {
              pcVar4 = MIR_alias_name(old_ctx,*pMVar10);
              pMVar5 = new_ctx;
              MVar3 = MIR_alias(new_ctx,pcVar4);
              *pMVar10 = MVar3;
            }
          }
          else if ((char)pMVar10[-4] == '\t') {
            str.s = *(char **)pMVar10;
            str.len = *(size_t *)(pMVar10 + -2);
            pMVar5 = (MIR_context_t)&stack0xffffffffffffffb8;
            get_ctx_string((string *)&stack0xffffffffffffffb8,new_ctx,str);
            *(c2mir_ctx **)(pMVar10 + -2) = local_40;
            *(MIR_error_func_t *)pMVar10 = p_Stack_38;
          }
          pMVar10 = pMVar10 + 0xc;
        }
        pDVar14 = (DLIST_MIR_insn_t *)&(pMVar2->insn_link).next;
      }
    }
    else if (*(MIR_item_type_t *)&item->insn_nops == MIR_proto_item) {
      pMVar5 = new_ctx;
      change_var_names(new_ctx,((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->proto->args)
      ;
    }
    pDVar12 = (DLIST_MIR_item_t *)&item->func_redef_permission_p;
  }
  (*old_ctx->error_func)(MIR_ctx_change_error,"Change context of a loaded module");
LAB_0011785a:
  __assert_fail("item == tab_item",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0xb11,"void MIR_change_module_ctx(MIR_context_t, MIR_module_t, MIR_context_t)");
}

Assistant:

void MIR_change_module_ctx (MIR_context_t old_ctx, MIR_module_t m, MIR_context_t new_ctx) {
  MIR_item_t item, tab_item;
  MIR_op_mode_t mode;
  const char *name, *new_name;

  DLIST_REMOVE (MIR_module_t, *MIR_get_module_list (old_ctx), m);
  DLIST_APPEND (MIR_module_t, *MIR_get_module_list (new_ctx), m);
  m->name = get_ctx_str (new_ctx, m->name);
  for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item)) {
    if (item->addr != NULL)
      MIR_get_error_func (old_ctx) (MIR_ctx_change_error, "Change context of a loaded module");
    if ((name = MIR_item_name (old_ctx, item)) != NULL) {
      new_name = get_ctx_str (new_ctx, name);
      if (item_tab_find (old_ctx, name, m) != item) {
        set_item_name (item, new_name);
      } else {
        item_tab_remove (old_ctx, item);
        set_item_name (item, new_name);
        tab_item = item_tab_insert (new_ctx, item);
        mir_assert (item == tab_item);
      }
    }
    if (item->item_type == MIR_proto_item) {
      change_var_names (new_ctx, item->u.proto->args);
    } else if (item->item_type == MIR_func_item) {
      func_regs_t func_regs = item->u.func->internal;
      reg_desc_t *rds = VARR_ADDR (reg_desc_t, func_regs->reg_descs);

      for (size_t i = 1; i < VARR_LENGTH (reg_desc_t, func_regs->reg_descs); i++) {
        rds[i].name = (char *) get_ctx_str (new_ctx, rds[i].name);
        if (rds[i].hard_reg_name != NULL)
          rds[i].hard_reg_name = (char *) get_ctx_str (new_ctx, rds[i].hard_reg_name);
      }
      change_var_names (new_ctx, item->u.func->vars);
      if (item->u.func->global_vars != NULL) change_var_names (new_ctx, item->u.func->global_vars);

      for (MIR_insn_t insn = DLIST_HEAD (MIR_insn_t, item->u.func->insns); insn != NULL;
           insn = DLIST_NEXT (MIR_insn_t, insn)) {
        for (size_t i = 0; i < insn->nops; i++) {
          if ((mode = insn->ops[i].mode) == MIR_OP_STR) {
            insn->ops[i].u.str = get_ctx_string (new_ctx, insn->ops[i].u.str).str;
          } else if (mode == MIR_OP_MEM) {
            if (insn->ops[i].u.mem.alias != 0)
              insn->ops[i].u.mem.alias
                = MIR_alias (new_ctx, MIR_alias_name (old_ctx, insn->ops[i].u.mem.alias));
            if (insn->ops[i].u.mem.nonalias != 0)
              insn->ops[i].u.mem.nonalias
                = MIR_alias (new_ctx, MIR_alias_name (old_ctx, insn->ops[i].u.mem.nonalias));
          }
        }
      }
    }
  }
#undef curr_label_num
  if (new_ctx->curr_label_num < old_ctx->curr_label_num)
    new_ctx->curr_label_num = old_ctx->curr_label_num;
#define curr_label_num ctx->curr_label_num
}